

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinit.c
# Opt level: O1

void lisp_Xexit(DspInterface dsp)

{
  if (Lisp_Xinitialized) {
    XDestroySubwindows(dsp->display_id,dsp->LispWindow);
    XDestroyWindow(dsp->display_id,dsp->LispWindow);
    XCloseDisplay(dsp->display_id);
    Lisp_Xinitialized = false;
    return;
  }
  __assert_fail("Lisp_Xinitialized",
                "/workspace/llm4binary/github/license_c_cmakelists/Interlisp[P]maiko/src/xinit.c",
                0x6f,"void lisp_Xexit(DspInterface)");
}

Assistant:

void lisp_Xexit(DspInterface dsp)
{
  assert(Lisp_Xinitialized);

  XLOCK;
  XDestroySubwindows(dsp->display_id, dsp->LispWindow);
  XDestroyWindow(dsp->display_id, dsp->LispWindow);
  XCloseDisplay(dsp->display_id);
  XUNLOCK(dsp);

  Lisp_Xinitialized = false;
}